

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

symbol * Symbol_find(char *key)

{
  int iVar1;
  char cVar2;
  char *pcVar3;
  uint uVar4;
  s_x2node *psVar5;
  
  uVar4 = 0;
  if (x2a != (s_x2 *)0x0) {
    cVar2 = *key;
    if (cVar2 != '\0') {
      pcVar3 = key + 1;
      uVar4 = 0;
      do {
        uVar4 = (int)cVar2 + uVar4 * 0xd;
        cVar2 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar2 != '\0');
    }
    for (psVar5 = x2a->ht[x2a->size - 1U & uVar4]; psVar5 != (s_x2node *)0x0; psVar5 = psVar5->next)
    {
      iVar1 = strcmp(psVar5->key,key);
      if (iVar1 == 0) {
        return psVar5->data;
      }
    }
  }
  return (symbol *)0x0;
}

Assistant:

struct symbol *Symbol_find(const char *key)
{
  unsigned h;
  x2node *np;

  if( x2a==0 ) return 0;
  h = strhash(key) & (x2a->size-1);
  np = x2a->ht[h];
  while( np ){
    if( strcmp(np->key,key)==0 ) break;
    np = np->next;
  }
  return np ? np->data : 0;
}